

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestlogonAtLogonStartTimeFixturelogonAtLogonStartTime::RunImpl
          (TestlogonAtLogonStartTimeFixturelogonAtLogonStartTime *this)

{
  TestDetails *details;
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper fixtureHelper;
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper local_660;
  
  details = &(this->super_Test).m_details;
  logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture
            (&local_660.super_logonAtLogonStartTimeFixture);
  local_660.super_logonAtLogonStartTimeFixture.super_acceptorFixture.super_sessionFixture.
  super_TestCallback.super_Responder._vptr_Responder = (_func_int **)&PTR__sessionFixture_00328330;
  local_660.super_logonAtLogonStartTimeFixture.super_acceptorFixture.super_sessionFixture.
  super_TestCallback.super_NullApplication.super_Application._vptr_Application =
       (Application)&PTR__logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper_00328388;
  local_660.m_details = details;
  UnitTest::ExecuteTest<SuiteSessionTests::logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)&local_660);
  return;
}

Assistant:

TEST_FIXTURE(logonAtLogonStartTimeFixture, logonAtLogonStartTime)
{
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );

  CHECK_EQUAL( 0, toLogon );
  CHECK_EQUAL( 0, toLogout );
  process_sleep( 1 );

  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 0, toLogout );

  process_sleep( 2 );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 1, toLogout );
}